

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_rom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32777e::Mapper2_is_ppu_address_in_range_Test::
~Mapper2_is_ppu_address_in_range_Test(Mapper2_is_ppu_address_in_range_Test *this)

{
  Mapper2_is_ppu_address_in_range_Test *this_local;
  
  ~Mapper2_is_ppu_address_in_range_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Mapper2, is_ppu_address_in_range) {
    std::string bytes{nrom_bytes(1, 1, Mapper::Mapper2)};
    std::stringstream ss(bytes);
    std::unique_ptr<IRom> rom = RomFactory::from_bytes(ss);

    EXPECT_TRUE(rom->is_ppu_address_in_range(0x0000u));
    EXPECT_TRUE(rom->is_ppu_address_in_range(0x2000u));
    EXPECT_TRUE(rom->is_ppu_address_in_range(0x2C00u));
    EXPECT_TRUE(rom->is_ppu_address_in_range(0x3EFFu));

    // Palette memory is created in membank factory.
    EXPECT_FALSE(rom->is_ppu_address_in_range(0x3F00u));
    EXPECT_FALSE(rom->is_ppu_address_in_range(0x3F20u));
    EXPECT_FALSE(rom->is_ppu_address_in_range(0x5000u));
}